

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vprtybq_ppc64(ppc_avr_t *r,ppc_avr_t *b)

{
  ulong uVar1;
  uint64_t res;
  ppc_avr_t *b_local;
  ppc_avr_t *r_local;
  
  uVar1 = (b->u64[0] ^ b->u64[1]) >> 0x20 ^ b->u64[0] ^ b->u64[1];
  uVar1 = uVar1 >> 0x10 ^ uVar1;
  r->u64[0] = (uVar1 >> 8 ^ uVar1) & 1;
  r->u64[1] = 0;
  return;
}

Assistant:

void helper_vprtybq(ppc_avr_t *r, ppc_avr_t *b)
{
    uint64_t res = b->u64[0] ^ b->u64[1];
    res ^= res >> 32;
    res ^= res >> 16;
    res ^= res >> 8;
    r->VsrD(1) = res & 1;
    r->VsrD(0) = 0;
}